

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::UnpackSnorm4x8Case::iterate(UnpackSnorm4x8Case *this)

{
  float *pfVar1;
  ostringstream *poVar2;
  uint uVar3;
  ShaderExecutor *pSVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  deUint32 dVar8;
  ostream *poVar9;
  ostream *poVar10;
  TestLog *pTVar11;
  uint *puVar12;
  uint uVar13;
  char *description;
  int iVar14;
  int iVar15;
  UnpackSnorm4x8Case *pUVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputs;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> outputs;
  Random rnd;
  void *in;
  Hex<8UL> local_270;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_268;
  UnpackSnorm4x8Case *local_250;
  uint local_248;
  int local_244;
  uint local_240;
  uint local_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  pointer local_208;
  ulong local_200;
  uint local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint local_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  undefined1 local_1d8 [16];
  deRandom local_1c0;
  undefined1 local_1b0 [384];
  
  local_250 = this;
  dVar8 = deStringHash((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_1c0,dVar8 ^ 0x776002);
  local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_208 = (pointer)0x0;
  local_218 = (undefined1  [16])0x0;
  local_1b0._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&local_268,(iterator)0x0,(uint *)local_1b0);
  local_1b0._0_4_ = 0x7fff8000;
  if (local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_268,
               (iterator)
               local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1b0);
  }
  else {
    *local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x7fff8000;
    local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1b0._0_4_ = 0x80007fff;
  if (local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_268,
               (iterator)
               local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1b0);
  }
  else {
    *local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x80007fff;
    local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1b0._0_4_ = 0xffffffff;
  if (local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_268,
               (iterator)
               local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1b0);
  }
  else {
    *local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0xffffffff;
    local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1b0._0_4_ = 0x1fffe;
  if (local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_268,
               (iterator)
               local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1b0);
  }
  else {
    *local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x1fffe;
    local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  iVar14 = 0x5f;
  do {
    dVar8 = deRandom_getUint32(&local_1c0);
    local_1b0._0_4_ = dVar8;
    if (local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_268,
                 (iterator)
                 local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)local_1b0);
    }
    else {
      *local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = dVar8;
      local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar14 = iVar14 + -1;
  } while (iVar14 != 0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_218,
             (long)local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start >> 2);
  local_1b0._0_8_ =
       ((local_250->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Executing shader for ",0x15)
  ;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  pUVar16 = local_250;
  local_1b0._0_8_ =
       local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_270.value = local_218._0_8_;
  (*((local_250->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar4 = (pUVar16->super_ShaderPackingFunctionCase).m_executor;
  (*pSVar4->_vptr_ShaderExecutor[6])
            (pSVar4,(ulong)((long)local_268.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_268.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2,local_1b0,&local_270
            );
  local_200 = (ulong)((long)local_268.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2;
  pUVar16 = local_250;
  if ((int)local_200 < 1) {
    iVar14 = 0;
  }
  else {
    lVar18 = 0;
    lVar17 = 0;
    iVar14 = 0;
    pTVar11 = (TestLog *)
              local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar12 = local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    auVar24 = extraout_XMM0;
    do {
      uVar19 = *(pointer)((long)&pTVar11->m_log + lVar17 * 4);
      uVar6 = auVar24._0_8_ & 0xffff0000ffff | (ulong)((ushort)(uVar19 >> 0x10) & 0xff00) << 0x10;
      uVar7 = auVar24._8_8_ & 0xffff0000ffff;
      auVar25._0_4_ = (float)((int)uVar6 >> 0x18);
      auVar25._4_4_ = (float)(int)((long)(uVar6 | (ulong)(ushort)(uVar19 >> 8) << 0x30) >> 0x38);
      auVar25._8_4_ = (float)((int)((uint)uVar7 | uVar19 << 0x10) >> 0x18);
      auVar25._12_4_ =
           (float)((int)((uint)(uVar7 >> 0x20) |
                        (uint)(((ulong)(ushort)(uVar19 << 8) << 0x30) >> 0x20)) >> 0x18);
      auVar5._8_4_ = 0x42fe0000;
      auVar5._0_8_ = 0x42fe000042fe0000;
      auVar5._12_4_ = 0x42fe0000;
      auVar26 = divps(auVar25,auVar5);
      auVar23._8_4_ = 0x3f800000;
      auVar23._0_8_ = 0x3f8000003f800000;
      auVar23._12_4_ = 0x3f800000;
      auVar24 = minps(auVar23,auVar26);
      uVar19 = -(uint)(auVar26._0_4_ < -1.0);
      uVar20 = -(uint)(auVar26._4_4_ < -1.0);
      uVar21 = -(uint)(auVar26._8_4_ < -1.0);
      uVar22 = -(uint)(auVar26._12_4_ < -1.0);
      auVar27._0_4_ = ~uVar19 & auVar24._0_4_;
      auVar27._4_4_ = ~uVar20 & auVar24._4_4_;
      auVar27._8_4_ = ~uVar21 & auVar24._8_4_;
      auVar27._12_4_ = ~uVar22 & auVar24._12_4_;
      auVar26._8_4_ = uVar21 & 0xbf800000;
      auVar26._0_8_ = CONCAT44(uVar20,uVar19) & 0xbf800000bf800000;
      auVar26._12_4_ = uVar22 & 0xbf800000;
      _local_228 = auVar27 | auVar26;
      pfVar1 = (float *)((long)(float *)local_218._0_8_ + lVar18);
      local_238 = *pfVar1;
      fStack_234 = pfVar1[1];
      fStack_230 = pfVar1[2];
      fStack_22c = pfVar1[3];
      uVar21 = local_228._0_4_;
      uVar22 = local_228._4_4_;
      local_1d8._8_4_ = local_228._8_4_;
      local_1d8._12_4_ = local_228._12_4_;
      local_1e8 = -(uint)((int)-fStack_22c < (int)(uVar21 ^ 0x80000000));
      uStack_1e4 = -(uint)((int)-fStack_230 < (int)(uVar22 ^ 0x80000000));
      uStack_1e0 = -(uint)((int)-fStack_234 < (int)(local_1d8._8_4_ ^ 0x80000000));
      uStack_1dc = -(uint)((int)-local_238 < (int)(local_1d8._12_4_ ^ 0x80000000));
      uVar19 = *(uint *)((long)(float *)local_218._0_8_ + lVar18 + 8);
      uVar20 = uVar19 - uVar22;
      if ((uStack_1e4 & 1) != 0) {
        uVar20 = uVar22 - uVar19;
      }
      uVar3 = *(uint *)((long)(float *)local_218._0_8_ + lVar18 + 0xc);
      local_248 = uVar3 - uVar21;
      if ((local_1e8 & 1) != 0) {
        local_248 = uVar21 - uVar3;
      }
      local_1d8._0_8_ = local_228._8_8_;
      local_1f8 = ~uStack_1e0 & (int)fStack_234 - local_1d8._8_4_ |
                  local_1d8._8_4_ - (int)fStack_234 & uStack_1e0;
      uStack_1f4 = ~uStack_1dc & (int)local_238 - local_1d8._12_4_ |
                   local_1d8._12_4_ - (int)local_238 & uStack_1dc;
      uStack_1f0 = ~uStack_1e0 & (int)fStack_230 - local_1d8._8_4_ |
                   local_1d8._8_4_ - (int)fStack_230 & uStack_1e0;
      uStack_1ec = ~uStack_1dc & (int)fStack_22c - local_1d8._12_4_ |
                   local_1d8._12_4_ - (int)fStack_22c & uStack_1dc;
      auVar24._0_4_ = -(uint)(-0x7fffffff < (int)(local_1f8 ^ 0x80000000));
      auVar24._4_4_ = -(uint)(-0x7fffffff < (int)(local_1f8 ^ 0x80000000));
      auVar24._8_4_ = -(uint)(-0x7fffffff < (int)(uStack_1f4 ^ 0x80000000));
      auVar24._12_4_ = -(uint)(-0x7fffffff < (int)(uStack_1f4 ^ 0x80000000));
      uVar13 = movmskpd(uVar21 - uVar3,auVar24);
      if ((((uVar13 & 2) != 0) || ((uVar13 & 1) != 0)) || (1 < (uVar20 | local_248))) {
        if (iVar14 < 10) {
          local_1b0._0_8_ =
               ((pUVar16->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                super_TestNode.m_testCtx)->m_log;
          poVar2 = (ostringstream *)(local_1b0 + 8);
          local_244 = iVar14;
          local_240 = uVar3;
          local_23c = uVar19;
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<(poVar2,(int)lVar17);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,"  expected unpackSnorm4x8(",0x1a);
          local_270.value =
               (deUint64)
               *(uint *)((long)(qpTestLog **)
                               local_268.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar17 * 4);
          tcu::Format::Hex<8UL>::toStream(&local_270,(ostream *)poVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,") = ",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"vec4(",5);
          poVar9 = std::ostream::_M_insert<double>((double)fStack_21c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," / ",3);
          local_270.value = (deUint64)(uint)local_228._4_4_;
          tcu::Format::Hex<8UL>::toStream(&local_270,poVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),", ",2);
          poVar9 = std::ostream::_M_insert<double>((double)fStack_220);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," / ",3);
          local_270.value = (deUint64)(uint)local_1d8._0_4_;
          tcu::Format::Hex<8UL>::toStream(&local_270,poVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),", ",2);
          poVar9 = std::ostream::_M_insert<double>((double)(float)local_228._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," / ",3);
          local_270.value = (deUint64)uVar22;
          tcu::Format::Hex<8UL>::toStream(&local_270,poVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),", ",2);
          poVar9 = (ostream *)(local_1b0 + 8);
          poVar10 = std::ostream::_M_insert<double>((double)(float)local_228._0_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," / ",3);
          local_270.value = (deUint64)uVar21;
          tcu::Format::Hex<8UL>::toStream(&local_270,poVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,", got vec4(",0xb);
          poVar10 = std::ostream::_M_insert<double>((double)local_238);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," / ",3);
          local_270.value = (deUint64)(uint)local_238;
          tcu::Format::Hex<8UL>::toStream(&local_270,poVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
          poVar10 = std::ostream::_M_insert<double>((double)fStack_234);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," / ",3);
          local_270.value = (deUint64)(uint)fStack_234;
          tcu::Format::Hex<8UL>::toStream(&local_270,poVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
          poVar10 = std::ostream::_M_insert<double>((double)fStack_230);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," / ",3);
          local_270.value = (deUint64)local_23c;
          tcu::Format::Hex<8UL>::toStream(&local_270,poVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
          poVar10 = std::ostream::_M_insert<double>((double)fStack_22c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," / ",3);
          local_270.value = (deUint64)local_240;
          tcu::Format::Hex<8UL>::toStream(&local_270,poVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n  ULP diffs = (",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"), max diff = ",0xe);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar9);
          auVar24._0_8_ = std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
          auVar24._8_8_ = extraout_XMM0_Qb;
          pUVar16 = local_250;
          iVar14 = local_244;
        }
        else if (iVar14 == 10) {
          local_1b0._0_8_ =
               ((pUVar16->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
          auVar24._0_8_ = std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
          auVar24._8_8_ = extraout_XMM0_Qb_00;
          pUVar16 = local_250;
        }
        iVar14 = iVar14 + 1;
        pTVar11 = (TestLog *)
                  local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar12 = local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      lVar17 = lVar17 + 1;
      lVar18 = lVar18 + 0x10;
    } while (lVar17 < (int)((ulong)((long)puVar12 - (long)pTVar11) >> 2));
  }
  local_1b0._0_8_ =
       ((pUVar16->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  iVar15 = (int)local_200;
  std::ostream::operator<<(poVar2,iVar15 - iVar14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," / ",3);
  std::ostream::operator<<(poVar2,iVar15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  description = "Pass";
  if (iVar14 != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((local_250->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,(uint)(iVar14 != 0),description);
  if ((pointer)local_218._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_218._0_8_,(long)local_208 - local_218._0_8_);
  }
  if ((TestLog *)
      local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (TestLog *)0x0) {
    operator_delete(local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const deUint32				maxDiff		= 1; // Rounding error.
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<deUint32>		inputs;
		std::vector<tcu::Vec4>		outputs;

		inputs.push_back(0x00000000u);
		inputs.push_back(0x7fff8000u);
		inputs.push_back(0x80007fffu);
		inputs.push_back(0xffffffffu);
		inputs.push_back(0x0001fffeu);

		// Random values.
		for (int ndx = 0; ndx < 95; ndx++)
			inputs.push_back(rnd.getUint32());

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deInt8	in0		= (deInt8)(deUint8)(inputs[valNdx] & 0xff);
				const deInt8	in1		= (deInt8)(deUint8)((inputs[valNdx] >> 8) & 0xff);
				const deInt8	in2		= (deInt8)(deUint8)((inputs[valNdx] >> 16) & 0xff);
				const deInt8	in3		= (deInt8)(deUint8)(inputs[valNdx] >> 24);
				const float		ref0	= de::clamp(float(in0) / 127.f, -1.0f, 1.0f);
				const float		ref1	= de::clamp(float(in1) / 127.f, -1.0f, 1.0f);
				const float		ref2	= de::clamp(float(in2) / 127.f, -1.0f, 1.0f);
				const float		ref3	= de::clamp(float(in3) / 127.f, -1.0f, 1.0f);
				const float		res0	= outputs[valNdx].x();
				const float		res1	= outputs[valNdx].y();
				const float		res2	= outputs[valNdx].z();
				const float		res3	= outputs[valNdx].w();

				const deUint32	diff0	= getUlpDiff(ref0, res0);
				const deUint32	diff1	= getUlpDiff(ref1, res1);
				const deUint32	diff2	= getUlpDiff(ref2, res2);
				const deUint32	diff3	= getUlpDiff(ref3, res3);

				if (diff0 > maxDiff || diff1 > maxDiff || diff2 > maxDiff || diff3 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx << ",\n"
															   << "  expected unpackSnorm4x8(" << tcu::toHex(inputs[valNdx]) << ") = "
															   << "vec4(" << HexFloat(ref0) << ", " << HexFloat(ref1) << ", " << HexFloat(ref2) << ", " << HexFloat(ref3) << ")"
															   << ", got vec4(" << HexFloat(res0) << ", " << HexFloat(res1) << ", " << HexFloat(res2) << ", " << HexFloat(res3) << ")"
															   << "\n  ULP diffs = (" << diff0 << ", " << diff1 << ", " << diff2 << ", " << diff3 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}